

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O1

LayoutBindingTestResult * __thiscall
glcts::LayoutBindingBaseCase::binding_compilation_errors
          (LayoutBindingTestResult *__return_storage_ptr__,LayoutBindingBaseCase *this)

{
  undefined1 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined1 *this_00;
  char *__s;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  undefined4 extraout_var;
  size_t sVar10;
  LayoutBindingProgram *pLVar11;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined1 auStack_348 [7];
  allocator<char> local_341;
  String local_340;
  allocator<char> local_319;
  String local_318;
  String local_2f8;
  String local_2d8;
  long *local_2b8 [2];
  long local_2a8 [2];
  String local_298;
  String local_278;
  String local_258;
  String local_238;
  String local_218;
  IProgramContextSupplier *local_1f8;
  String local_1f0;
  String decl;
  StringStream s;
  undefined4 extraout_var_00;
  
  decl._M_dataplus._M_p = (pointer)&decl.field_2;
  decl._M_string_length = 0;
  decl.field_2._M_local_buf[0] = '\0';
  puVar1 = &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70;
  std::ios_base::ios_base((ios_base *)puVar1);
  s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._112_8_ =
       glUniformMatrix3x2fv;
  s.super_ostringstream._328_8_ = 0;
  s.super_ostringstream._336_2_ = 0;
  s.super_ostringstream._344_8_ = 0;
  s.super_ostringstream._352_8_ = 0;
  s.super_ostringstream._360_8_ = 0;
  s.super_ostringstream._368_8_ = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
  s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&PTR__StringStream_02143dd0;
  s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._112_8_ =
       &PTR__StringStream_02143df8;
  iVar8 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
  __s = *(char **)(CONCAT44(extraout_var,iVar8) + 0x10);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(auStack_348 +
                         (long)s.super_ostringstream.
                               super_basic_ostream<char,_std::char_traits<char>_>.
                               _vptr_basic_ostream[-3]) + 0x1a0);
  }
  else {
    sVar10 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&s,__s,sVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&s,"(0.0);",6);
  std::__cxx11::stringbuf::str();
  setTemplateParam(this,(this->m_stage).type,"UNIFORM_ACCESS",&local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  StringStream::reset(&s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&s,"layout(binding=0) ",0x12);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&s,"uniform float tex0;",0x13);
  std::__cxx11::stringbuf::str();
  setTemplateParam(this,(this->m_stage).type,"UNIFORM_DECL",&local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  updateTemplate(this,(this->m_stage).type);
  local_1f8 = &this->super_IProgramContextSupplier;
  iVar8 = (*(this->super_IProgramContextSupplier)._vptr_IProgramContextSupplier[6])();
  pLVar11 = (LayoutBindingProgram *)CONCAT44(extraout_var_00,iVar8);
  bVar3 = LayoutBindingProgram::compiledAndLinked(pLVar11);
  if (bVar3) {
    LayoutBindingProgram::getErrorLog_abi_cxx11_(&local_340,pLVar11,true);
    __return_storage_ptr__->m_passed = false;
    __return_storage_ptr__->m_notRunForThisContext = false;
    (__return_storage_ptr__->m_reason)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_reason).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_reason,local_340._M_dataplus._M_p,
               local_340._M_dataplus._M_p + local_340._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
    (*pLVar11->_vptr_LayoutBindingProgram[1])(pLVar11);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
    std::ios_base::~ios_base((ios_base *)puVar1);
    if (bVar3) goto LAB_00be09dc;
  }
  else {
    (*pLVar11->_vptr_LayoutBindingProgram[1])(pLVar11);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
    std::ios_base::~ios_base((ios_base *)puVar1);
  }
  iVar8 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_340,*(char **)CONCAT44(extraout_var_01,iVar8),&local_341);
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"0.0","");
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x19])
            (&local_258,this,&local_2f8);
  iVar8 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,*(char **)(CONCAT44(extraout_var_02,iVar8) + 0x18),&local_319);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_218,this,0);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
            (&local_298,this,&local_218);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_2b8,this,0);
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"float","");
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
            (&local_238,this,local_2b8,&local_2d8);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_318,this,0);
  paVar2 = &local_1f0.field_2;
  local_1f0._M_string_length = 0;
  local_1f0.field_2._M_local_buf[0] = '\0';
  local_1f0._M_dataplus._M_p = (pointer)paVar2;
  buildUniformDecl((String *)&s,this,&local_340,&local_258,&local_278,&local_298,&local_238,
                   &local_318,&local_1f0);
  std::__cxx11::string::operator=((string *)&decl,(string *)&s);
  if (s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
      != (_func_int **)
         &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    CONCAT71(s.super_ostringstream.
                             super_basic_ostream<char,_std::char_traits<char>_>._17_7_,
                             s.super_ostringstream.
                             super_basic_ostream<char,_std::char_traits<char>_>._16_1_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f0._M_dataplus._M_p,
                    CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                             local_1f0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,
                    CONCAT71(local_318.field_2._M_allocated_capacity._1_7_,
                             local_318.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if (local_2b8[0] != local_2a8) {
    operator_delete(local_2b8[0],local_2a8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  setTemplateParam(this,(this->m_stage).type,"UNIFORM_DECL",&decl);
  updateTemplate(this,(this->m_stage).type);
  iVar8 = (*local_1f8->_vptr_IProgramContextSupplier[6])();
  pLVar11 = (LayoutBindingProgram *)CONCAT44(extraout_var_03,iVar8);
  bVar4 = LayoutBindingProgram::compiledAndLinked(pLVar11);
  if (bVar3 || bVar4) {
    LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)&s,pLVar11,true);
    __return_storage_ptr__->m_passed = false;
    __return_storage_ptr__->m_notRunForThisContext = false;
    (__return_storage_ptr__->m_reason)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_reason).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_reason,
               s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
               _vptr_basic_ostream,
               s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ +
               (long)s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                     _vptr_basic_ostream);
  }
  else {
    (*pLVar11->_vptr_LayoutBindingProgram[1])(pLVar11);
    iVar8 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_340,*(char **)CONCAT44(extraout_var_04,iVar8),&local_341);
    local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"-1","");
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x19])
              (&local_258,this,&local_2f8);
    iVar8 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,*(char **)(CONCAT44(extraout_var_05,iVar8) + 0x18),&local_319);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_218,this,0);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
              (&local_298,this,&local_218);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_2b8,this,0);
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"float","");
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
              (&local_238,this,local_2b8,&local_2d8);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_318,this,0);
    local_1f0._M_string_length = 0;
    local_1f0.field_2._M_local_buf[0] = '\0';
    local_1f0._M_dataplus._M_p = (pointer)paVar2;
    buildUniformDecl((String *)&s,this,&local_340,&local_258,&local_278,&local_298,&local_238,
                     &local_318,&local_1f0);
    std::__cxx11::string::operator=((string *)&decl,(string *)&s);
    if (s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
        != (_func_int **)
           &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
      operator_delete(s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream,
                      CONCAT71(s.super_ostringstream.
                               super_basic_ostream<char,_std::char_traits<char>_>._17_7_,
                               s.super_ostringstream.
                               super_basic_ostream<char,_std::char_traits<char>_>._16_1_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != paVar2) {
      operator_delete(local_1f0._M_dataplus._M_p,
                      CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                               local_1f0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p,
                      CONCAT71(local_318.field_2._M_allocated_capacity._1_7_,
                               local_318.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if (local_2b8[0] != local_2a8) {
      operator_delete(local_2b8[0],local_2a8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
    setTemplateParam(this,(this->m_stage).type,"UNIFORM_DECL",&decl);
    updateTemplate(this,(this->m_stage).type);
    iVar8 = (*local_1f8->_vptr_IProgramContextSupplier[6])();
    pLVar11 = (LayoutBindingProgram *)CONCAT44(extraout_var_06,iVar8);
    bVar5 = LayoutBindingProgram::compiledAndLinked(pLVar11);
    if ((bVar3 || bVar4) || bVar5) {
      LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)&s,pLVar11,true);
      __return_storage_ptr__->m_passed = false;
      __return_storage_ptr__->m_notRunForThisContext = false;
      (__return_storage_ptr__->m_reason)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_reason).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_reason,
                 s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                 _vptr_basic_ostream,
                 s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ +
                 (long)s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                       _vptr_basic_ostream);
    }
    else {
      (*pLVar11->_vptr_LayoutBindingProgram[1])(pLVar11);
      iVar8 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_340,*(char **)CONCAT44(extraout_var_07,iVar8),
                 (allocator<char> *)&local_1f0);
      uVar9 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x20])(this);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1a])
                (&local_258,this,(ulong)uVar9);
      iVar8 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f8,*(char **)(CONCAT44(extraout_var_08,iVar8) + 0x18),&local_341)
      ;
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                (&local_298,this,0);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
                (&local_278,this,&local_298);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                (&local_238,this,0);
      local_2b8[0] = local_2a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"float","");
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
                (&local_218,this,&local_238,local_2b8);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                (&local_2d8,this,0);
      local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
      local_318._M_string_length = 0;
      local_318.field_2._M_local_buf[0] = '\0';
      buildUniformDecl((String *)&s,this,&local_340,&local_258,&local_2f8,&local_278,&local_218,
                       &local_2d8,&local_318);
      std::__cxx11::string::operator=((string *)&decl,(string *)&s);
      if (s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
          _vptr_basic_ostream !=
          (_func_int **)
          &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream,
                        CONCAT71(s.super_ostringstream.
                                 super_basic_ostream<char,_std::char_traits<char>_>._17_7_,
                                 s.super_ostringstream.
                                 super_basic_ostream<char,_std::char_traits<char>_>._16_1_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != &local_318.field_2) {
        operator_delete(local_318._M_dataplus._M_p,
                        CONCAT71(local_318.field_2._M_allocated_capacity._1_7_,
                                 local_318.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if (local_2b8[0] != local_2a8) {
        operator_delete(local_2b8[0],local_2a8[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
      }
      setTemplateParam(this,(this->m_stage).type,"UNIFORM_DECL",&decl);
      updateTemplate(this,(this->m_stage).type);
      iVar8 = (*local_1f8->_vptr_IProgramContextSupplier[6])();
      pLVar11 = (LayoutBindingProgram *)CONCAT44(extraout_var_09,iVar8);
      bVar6 = LayoutBindingProgram::compiledAndLinked(pLVar11);
      if (((!bVar3 && !bVar4) && !bVar5) && !bVar6) {
        (*pLVar11->_vptr_LayoutBindingProgram[1])(pLVar11);
        iVar8 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_340,*(char **)CONCAT44(extraout_var_10,iVar8),
                   (allocator<char> *)&local_1f0);
        uVar9 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x20])(this);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1a])
                  (&local_258,this,(ulong)uVar9);
        iVar8 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2f8,*(char **)(CONCAT44(extraout_var_11,iVar8) + 0x18),
                   &local_341);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                  (&local_298,this,0);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
                  (&local_278,this,&local_298);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                  (&local_238,this,0);
        local_2b8[0] = local_2a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"float","");
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
                  (&local_218,this,&local_238,local_2b8);
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                  (&local_2d8,this,0);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        local_318._M_string_length = 0;
        local_318.field_2._M_local_buf[0] = '\0';
        buildUniformDecl((String *)&s,this,&local_340,&local_258,&local_2f8,&local_278,&local_218,
                         &local_2d8,&local_318);
        std::__cxx11::string::operator=((string *)&decl,(string *)&s);
        puVar1 = &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                  field_0x10;
        if (s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
            _vptr_basic_ostream != (_func_int **)puVar1) {
          operator_delete(s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream,
                          CONCAT71(s.super_ostringstream.
                                   super_basic_ostream<char,_std::char_traits<char>_>._17_7_,
                                   s.super_ostringstream.
                                   super_basic_ostream<char,_std::char_traits<char>_>._16_1_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,
                          CONCAT71(local_318.field_2._M_allocated_capacity._1_7_,
                                   local_318.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        if (local_2b8[0] != local_2a8) {
          operator_delete(local_2b8[0],local_2a8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
          operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != &local_340.field_2) {
          operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
        }
        setTemplateParam(this,(this->m_stage).type,"UNIFORM_DECL",&decl);
        this_00 = &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                   field_0x70;
        std::ios_base::ios_base((ios_base *)this_00);
        s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._112_8_ =
             glUniformMatrix3x2fv;
        s.super_ostringstream._328_8_ = 0;
        s.super_ostringstream._336_2_ = 0;
        s.super_ostringstream._344_8_ = 0;
        s.super_ostringstream._352_8_ = 0;
        s.super_ostringstream._360_8_ = 0;
        s.super_ostringstream._368_8_ = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
        s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
             = (_func_int **)&PTR__StringStream_02143dd0;
        s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._112_8_ =
             &PTR__StringStream_02143df8;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&s,"vec4(0.0);\n",0xb);
        std::__cxx11::stringbuf::str();
        setTemplateParam(this,(this->m_stage).type,"UNIFORM_ACCESS",&local_340);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != &local_340.field_2) {
          operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
        }
        updateTemplate(this,(this->m_stage).type);
        iVar8 = (*local_1f8->_vptr_IProgramContextSupplier[6])();
        pLVar11 = (LayoutBindingProgram *)CONCAT44(extraout_var_12,iVar8);
        bVar7 = LayoutBindingProgram::compiledAndLinked(pLVar11);
        if ((((bVar3 || bVar4) || bVar5) || bVar6) || bVar7) {
          LayoutBindingProgram::getErrorLog_abi_cxx11_(&local_340,pLVar11,true);
          __return_storage_ptr__->m_passed = false;
          __return_storage_ptr__->m_notRunForThisContext = false;
          (__return_storage_ptr__->m_reason)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->m_reason).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->m_reason,local_340._M_dataplus._M_p,
                     local_340._M_dataplus._M_p + local_340._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_340._M_dataplus._M_p != &local_340.field_2) {
            operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
          }
          (*pLVar11->_vptr_LayoutBindingProgram[1])(pLVar11);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
          std::ios_base::~ios_base((ios_base *)this_00);
        }
        else {
          (*pLVar11->_vptr_LayoutBindingProgram[1])(pLVar11);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
          std::ios_base::~ios_base((ios_base *)this_00);
          s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
          s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._16_1_ = 0;
          __return_storage_ptr__->m_passed = (((!bVar3 && !bVar4) && !bVar5) && !bVar6) && !bVar7;
          __return_storage_ptr__->m_notRunForThisContext = false;
          (__return_storage_ptr__->m_reason)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->m_reason).field_2;
          s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
          _vptr_basic_ostream = (_func_int **)puVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->m_reason,puVar1,puVar1);
          if (s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream != (_func_int **)puVar1) {
            operator_delete(s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>
                            ._vptr_basic_ostream,
                            CONCAT71(s.super_ostringstream.
                                     super_basic_ostream<char,_std::char_traits<char>_>._17_7_,
                                     s.super_ostringstream.
                                     super_basic_ostream<char,_std::char_traits<char>_>._16_1_) + 1)
            ;
          }
        }
        goto LAB_00be09dc;
      }
      LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)&s,pLVar11,true);
      __return_storage_ptr__->m_passed = false;
      __return_storage_ptr__->m_notRunForThisContext = false;
      (__return_storage_ptr__->m_reason)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_reason).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_reason,
                 s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                 _vptr_basic_ostream,
                 s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ +
                 (long)s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                       _vptr_basic_ostream);
    }
  }
  if (s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
      != (_func_int **)
         &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    CONCAT71(s.super_ostringstream.
                             super_basic_ostream<char,_std::char_traits<char>_>._17_7_,
                             s.super_ostringstream.
                             super_basic_ostream<char,_std::char_traits<char>_>._16_1_) + 1);
  }
  (*pLVar11->_vptr_LayoutBindingProgram[1])(pLVar11);
LAB_00be09dc:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)decl._M_dataplus._M_p != &decl.field_2) {
    operator_delete(decl._M_dataplus._M_p,
                    CONCAT71(decl.field_2._M_allocated_capacity._1_7_,decl.field_2._M_local_buf[0])
                    + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

LayoutBindingTestResult LayoutBindingBaseCase::binding_compilation_errors(void)
{
	bool   passed = true;
	String decl;

	// verify "uniform float var;" doesn't compile
	{
		StringStream s;
		s << getTestParameters().vector_type << "(0.0);";

		setTemplateParam("UNIFORM_ACCESS", s.str());
		s.reset();
		s << "layout(binding=0) "
		  << "uniform float tex0;";
		setTemplateParam("UNIFORM_DECL", s.str());
		updateTemplate();

		LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
		passed &= !program->compiledAndLinked();
		if (!passed)
		{
			return LayoutBindingTestResult(passed, program->getErrorLog(true));
		}
	}

	// verify that non-constant integer expression in binding fails
	{
		decl = buildUniformDecl(String(getTestParameters().keyword), buildLayout(String("0.0")),
								String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
								buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
		setTemplateParam("UNIFORM_DECL", decl);
		updateTemplate();

		LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
		passed &= !program->compiledAndLinked();
		if (!passed)
		{
			return LayoutBindingTestResult(passed, program->getErrorLog(true));
		}
	}

	{
		decl = buildUniformDecl(String(getTestParameters().keyword), buildLayout(String("-1")),
								String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
								buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
		setTemplateParam("UNIFORM_DECL", decl);
		updateTemplate();

		LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
		passed &= !program->compiledAndLinked();
		if (!passed)
		{
			return LayoutBindingTestResult(passed, program->getErrorLog(true));
		}
	}
	{
		decl = buildUniformDecl(String(getTestParameters().keyword), buildLayout(maxBindings()),
								String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
								buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
		setTemplateParam("UNIFORM_DECL", decl);
		updateTemplate();

		LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
		passed &= !program->compiledAndLinked();
		if (!passed)
		{
			return LayoutBindingTestResult(passed, program->getErrorLog(true));
		}
	}
	{
		decl = buildUniformDecl(String(getTestParameters().keyword), buildLayout(maxBindings()),
								String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
								buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
		setTemplateParam("UNIFORM_DECL", decl);

		StringStream s;
		s << "vec4(0.0);\n";
		setTemplateParam("UNIFORM_ACCESS", s.str());
		updateTemplate();

		LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
		passed &= !program->compiledAndLinked();
		if (!passed)
		{
			return LayoutBindingTestResult(passed, program->getErrorLog(true));
		}
	}
	return LayoutBindingTestResult(passed, String());
}